

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

void __thiscall
dynamicgraph::
Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::trace
          (Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,ostream *os)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1d])();
  std::operator<<(os,(string *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void Signal<T, Time>::trace(std::ostream &os) const {
  try {
    signal_io<T>::trace(this->accessCopy(), os);
  } catch DG_RETHROW catch (...) {
    DG_THROW ExceptionSignal(ExceptionSignal::SET_IMPOSSIBLE,
                             "TRACE operation not possible with this signal. ",
                             "(bad cast while getting value from %s).",
                             SignalBase<Time>::getName().c_str());
  }
}